

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var Js::JavascriptString::EntryReplace(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  Var instance;
  ScriptContext *scriptContext;
  int in_stack_00000010;
  undefined1 local_70 [8];
  AutoTagNativeLibraryEntry __tag;
  undefined1 local_40 [8];
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_40 = (undefined1  [8])callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x678,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bbe609;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,(CallInfo *)local_40,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  scriptContext = (ScriptContext *)register0x00000020;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_70,function,(CallInfo)local_40,
             L"String.prototype.replace",&stack0x00000000);
  if (((ulong)local_40 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x67f,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bbe609:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (((pSVar1->config).threadConfig)->m_ES6RegExSymbols == true) {
    if ((callInfo_local._0_4_ & 0xffffff) == 0) {
LAB_00bbe60b:
      JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"String.prototype.replace");
    }
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    BVar4 = JavascriptConversion::CheckObjectCoercible(pvVar6,pSVar1);
    if (BVar4 == 0) goto LAB_00bbe60b;
    if ((callInfo_local._0_4_ & 0xfffffe) != 0) {
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      BVar4 = JavascriptOperators::IsUndefinedOrNull(pvVar6);
      if (BVar4 == 0) {
        pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
        instance = GetRegExSymbolFunction(pvVar6,0x16,pSVar1);
        BVar4 = JavascriptOperators::IsUndefinedOrNull(instance);
        if (BVar4 == 0) {
          pvVar6 = CallRegExSymbolFunction<2>
                             (instance,pvVar6,(Arguments *)&callInfo_local,
                              L"String.prototype.replace",pSVar1);
          goto LAB_00bbe5d2;
        }
      }
    }
  }
  __tag.entry.next = (Entry *)0x0;
  GetThisStringArgument
            ((ArgumentReader *)&callInfo_local,pSVar1,L"String.prototype.replace",
             (JavascriptString **)&__tag.entry.next);
  pvVar6 = DoStringReplace((JavascriptString *)&callInfo_local,(Arguments *)local_40,
                           (CallInfo *)__tag.entry.next,(JavascriptString *)pSVar1,scriptContext);
LAB_00bbe5d2:
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_70);
  return pvVar6;
}

Assistant:

Var JavascriptString::EntryReplace(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        PCWSTR const varName = _u("String.prototype.replace");

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, varName);

        Assert(!(callInfo.Flags & CallFlags_New));

        auto fallback = [&](JavascriptString* stringObj)
        {
            return DoStringReplace(args, callInfo, stringObj, scriptContext);
        };
        return DelegateToRegExSymbolFunction<2>(args, PropertyIds::_symbolReplace, fallback, varName, scriptContext);
    }